

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Truck.cpp
# Opt level: O0

void __thiscall Truck::Truck(Truck *this,string *plate)

{
  string *plate_local;
  Truck *this_local;
  
  std::__cxx11::string::string((string *)&this->plate);
  this->capacity = INFINITY;
  std::__cxx11::string::operator=((string *)&this->plate,(string *)plate);
  return;
}

Assistant:

Truck::Truck(string plate) {
    this->capacity = INFINITY;
    this->plate = plate;
}